

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  int iVar511;
  uchar *a;
  ulong uVar512;
  ulong uVar513;
  ulong uVar514;
  ulong uVar515;
  ulong uVar516;
  ulong uVar517;
  ulong uVar518;
  ulong uVar519;
  ulong uVar520;
  ulong uVar521;
  ulong uVar522;
  int overflow;
  secp256k1_scalar s;
  secp256k1_fe xd;
  uchar sx [32];
  secp256k1_fe px;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xn;
  secp256k1_fe i;
  secp256k1_ge p;
  uint local_284;
  undefined8 local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  uchar *local_240;
  uchar *local_238;
  uchar *local_230;
  secp256k1_scalar local_228;
  secp256k1_fe local_200;
  secp256k1_gej local_1d8;
  secp256k1_fe local_158;
  secp256k1_fe local_128;
  secp256k1_fe local_100;
  secp256k1_fe local_d8;
  secp256k1_fe local_b0;
  secp256k1_ge local_88;
  
  if (output == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_5();
  }
  else if (ell_a64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_4();
  }
  else if (ell_b64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_3();
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_2();
  }
  else {
    if (hashfp != (secp256k1_ellswift_xdh_hash_function)0x0) {
      a = ell_a64;
      if (party == 0) {
        a = ell_b64;
      }
      local_240 = output;
      local_238 = ell_a64;
      local_230 = ell_b64;
      secp256k1_fe_impl_set_b32_mod(&local_100,a);
      secp256k1_fe_impl_set_b32_mod(&local_128,a + 0x20);
      secp256k1_ellswift_xswiftec_frac_var(&local_d8,&local_200,&local_100,&local_128);
      secp256k1_scalar_set_b32(&local_228,seckey32,(int *)&local_284);
      local_284 = (uint)(((local_228.d[1] == 0 && local_228.d[0] == 0) && local_228.d[2] == 0) &&
                        local_228.d[3] == 0);
      local_1d8.x.n[0] = CONCAT44(local_1d8.x.n[0]._4_4_,local_284);
      uVar512 = (long)(int)local_284 - 1;
      local_250 = (ulong)local_284 | local_228.d[0] & uVar512;
      local_248 = local_228.d[1] & uVar512;
      local_228.d[2] = local_228.d[2] & uVar512;
      local_228.d[3] = uVar512 & local_228.d[3];
      uVar512 = local_d8.n[0] * 2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_d8.n[3];
      auVar271._8_8_ = 0;
      auVar271._0_8_ = uVar512;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_d8.n[2];
      auVar272._8_8_ = 0;
      auVar272._0_8_ = local_d8.n[1] * 2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_d8.n[4];
      auVar273._8_8_ = 0;
      auVar273._0_8_ = local_d8.n[4];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = SUB168(auVar3 * auVar273,0);
      auVar1 = auVar4 * ZEXT816(0x1000003d10) + auVar2 * auVar272 + auVar1 * auVar271;
      uVar513 = local_d8.n[4] * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar513;
      auVar274._8_8_ = 0;
      auVar274._0_8_ = local_d8.n[0];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_d8.n[3];
      auVar275._8_8_ = 0;
      auVar275._0_8_ = local_d8.n[1] * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_d8.n[2];
      auVar276._8_8_ = 0;
      auVar276._0_8_ = local_d8.n[2];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(auVar3 * auVar273,8);
      auVar2 = auVar8 * ZEXT816(0x1000003d10000) +
               auVar5 * auVar274 + auVar7 * auVar276 + auVar6 * auVar275 + (auVar1 >> 0x34);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_d8.n[0];
      auVar277._8_8_ = 0;
      auVar277._0_8_ = local_d8.n[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar513;
      auVar278._8_8_ = 0;
      auVar278._0_8_ = local_d8.n[1];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_d8.n[3];
      auVar279._8_8_ = 0;
      auVar279._0_8_ = local_d8.n[2] * 2;
      auVar3 = auVar11 * auVar279 + auVar10 * auVar278 + (auVar2 >> 0x34);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar12 * ZEXT816(0x1000003d1) + auVar9 * auVar277;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_d8.n[1];
      auVar280._8_8_ = 0;
      auVar280._0_8_ = uVar512;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar513;
      auVar281._8_8_ = 0;
      auVar281._0_8_ = local_d8.n[2];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_d8.n[3];
      auVar282._8_8_ = 0;
      auVar282._0_8_ = local_d8.n[3];
      auVar3 = auVar15 * auVar282 + auVar14 * auVar281 + (auVar3 >> 0x34);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar6 = auVar16 * ZEXT816(0x1000003d10) + auVar13 * auVar280 + (auVar4 >> 0x34);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_d8.n[2];
      auVar283._8_8_ = 0;
      auVar283._0_8_ = uVar512;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_d8.n[1];
      auVar284._8_8_ = 0;
      auVar284._0_8_ = local_d8.n[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar513;
      auVar285._8_8_ = 0;
      auVar285._0_8_ = local_d8.n[3];
      auVar3 = auVar19 * auVar285 + (auVar3 >> 0x34);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar3._0_8_;
      auVar5 = auVar18 * auVar284 + auVar17 * auVar283 + auVar20 * ZEXT816(0x1000003d10) +
               (auVar6 >> 0x34);
      auVar7 = auVar5 >> 0x34;
      auVar490._8_8_ = 0;
      auVar490._0_8_ = auVar7._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auVar3._8_8_;
      auVar489._8_8_ = auVar7._8_8_;
      auVar489._0_8_ = auVar1._0_8_ & 0xffffffffffffe;
      auVar490 = auVar21 * ZEXT816(0x1000003d10000) + auVar489 + auVar490;
      uVar512 = auVar490._0_8_;
      uVar516 = auVar4._0_8_ & 0xfffffffffffff;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar516;
      auVar286._8_8_ = 0;
      auVar286._0_8_ = local_d8.n[3];
      uVar520 = (auVar490._8_8_ << 0xc | uVar512 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      uVar522 = auVar6._0_8_ & 0xfffffffffffff;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar522;
      auVar287._8_8_ = 0;
      auVar287._0_8_ = local_d8.n[2];
      uVar513 = auVar5._0_8_ & 0xfffffffffffff;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar513;
      auVar288._8_8_ = 0;
      auVar288._0_8_ = local_d8.n[1];
      uVar512 = uVar512 & 0xfffffffffffff;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar512;
      auVar289._8_8_ = 0;
      auVar289._0_8_ = local_d8.n[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar520;
      auVar290._8_8_ = 0;
      auVar290._0_8_ = local_d8.n[4];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = SUB168(auVar26 * auVar290,0);
      auVar3 = auVar23 * auVar287 + auVar22 * auVar286 + auVar24 * auVar288 + auVar25 * auVar289 +
               auVar27 * ZEXT816(0x1000003d10);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar516;
      auVar291._8_8_ = 0;
      auVar291._0_8_ = local_d8.n[4];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar522;
      auVar292._8_8_ = 0;
      auVar292._0_8_ = local_d8.n[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar513;
      auVar293._8_8_ = 0;
      auVar293._0_8_ = local_d8.n[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar512;
      auVar294._8_8_ = 0;
      auVar294._0_8_ = local_d8.n[1];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar520;
      auVar295._8_8_ = 0;
      auVar295._0_8_ = local_d8.n[0];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = SUB168(auVar26 * auVar290,8);
      auVar1 = auVar33 * ZEXT816(0x1000003d10000) +
               auVar32 * auVar295 +
               auVar31 * auVar294 + auVar30 * auVar293 + auVar29 * auVar292 + auVar28 * auVar291 +
               (auVar3 >> 0x34);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar516;
      auVar296._8_8_ = 0;
      auVar296._0_8_ = local_d8.n[0];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar522;
      auVar297._8_8_ = 0;
      auVar297._0_8_ = local_d8.n[4];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar513;
      auVar298._8_8_ = 0;
      auVar298._0_8_ = local_d8.n[3];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar512;
      auVar299._8_8_ = 0;
      auVar299._0_8_ = local_d8.n[2];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar520;
      auVar300._8_8_ = 0;
      auVar300._0_8_ = local_d8.n[1];
      local_258 = auVar1._0_8_ & 0xffffffffffff;
      auVar2 = auVar38 * auVar300 + auVar37 * auVar299 + auVar36 * auVar298 + auVar35 * auVar297 +
               (auVar1 >> 0x34);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar1 = auVar34 * auVar296 + auVar39 * ZEXT816(0x1000003d1);
      local_260 = auVar1._0_8_;
      uVar518 = auVar1._8_8_;
      auVar481._8_8_ = uVar518 >> 0x34;
      auVar481._0_8_ = uVar518 * 0x1000 | local_260 >> 0x34;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar516;
      auVar301._8_8_ = 0;
      auVar301._0_8_ = local_d8.n[1];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar522;
      auVar302._8_8_ = 0;
      auVar302._0_8_ = local_d8.n[0];
      local_260 = local_260 & 0xfffffffffffff;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar513;
      auVar303._8_8_ = 0;
      auVar303._0_8_ = local_d8.n[4];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar512;
      auVar304._8_8_ = 0;
      auVar304._0_8_ = local_d8.n[3];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar520;
      auVar305._8_8_ = 0;
      auVar305._0_8_ = local_d8.n[2];
      auVar1 = auVar44 * auVar305 + auVar43 * auVar304 + auVar42 * auVar303 + (auVar2 >> 0x34);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar481 = auVar45 * ZEXT816(0x1000003d10) + auVar40 * auVar301 + auVar41 * auVar302 +
                 auVar481;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar516;
      auVar306._8_8_ = 0;
      auVar306._0_8_ = local_d8.n[2];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar522;
      auVar307._8_8_ = 0;
      auVar307._0_8_ = local_d8.n[1];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar513;
      auVar308._8_8_ = 0;
      auVar308._0_8_ = local_d8.n[0];
      local_268 = auVar481._0_8_ & 0xfffffffffffff;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar512;
      auVar309._8_8_ = 0;
      auVar309._0_8_ = local_d8.n[4];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar520;
      auVar310._8_8_ = 0;
      auVar310._0_8_ = local_d8.n[3];
      auVar1 = auVar50 * auVar310 + auVar49 * auVar309 + (auVar1 >> 0x34);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auVar1._0_8_;
      auVar2 = auVar51 * ZEXT816(0x1000003d10) +
               auVar48 * auVar308 + auVar47 * auVar307 + auVar46 * auVar306 + (auVar481 >> 0x34);
      auVar4 = auVar2 >> 0x34;
      auVar492._8_8_ = 0;
      auVar492._0_8_ = auVar4._0_8_;
      local_270 = auVar2._0_8_ & 0xfffffffffffff;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = auVar1._8_8_;
      auVar491._8_8_ = auVar4._8_8_;
      auVar491._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar492 = auVar52 * ZEXT816(0x1000003d10000) + auVar491 + auVar492;
      uVar515 = auVar492._0_8_;
      local_278 = auVar492._8_8_ << 0xc | uVar515 >> 0x34;
      uVar512 = local_200.n[0] * 2;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_200.n[3];
      auVar311._8_8_ = 0;
      auVar311._0_8_ = uVar512;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_200.n[2];
      auVar312._8_8_ = 0;
      auVar312._0_8_ = local_200.n[1] * 2;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_200.n[4];
      auVar313._8_8_ = 0;
      auVar313._0_8_ = local_200.n[4];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = SUB168(auVar55 * auVar313,0);
      auVar1 = auVar56 * ZEXT816(0x1000003d10) + auVar54 * auVar312 + auVar53 * auVar311;
      uVar513 = local_200.n[4] * 2;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar513;
      auVar314._8_8_ = 0;
      auVar314._0_8_ = local_200.n[0];
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_200.n[3];
      auVar315._8_8_ = 0;
      auVar315._0_8_ = local_200.n[1] * 2;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_200.n[2];
      auVar316._8_8_ = 0;
      auVar316._0_8_ = local_200.n[2];
      auVar60._8_8_ = 0;
      auVar60._0_8_ = SUB168(auVar55 * auVar313,8);
      auVar2 = auVar60 * ZEXT816(0x1000003d10000) +
               auVar57 * auVar314 + auVar59 * auVar316 + auVar58 * auVar315 + (auVar1 >> 0x34);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_200.n[0];
      auVar317._8_8_ = 0;
      auVar317._0_8_ = local_200.n[0];
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar513;
      auVar318._8_8_ = 0;
      auVar318._0_8_ = local_200.n[1];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_200.n[3];
      auVar319._8_8_ = 0;
      auVar319._0_8_ = local_200.n[2] * 2;
      auVar3 = auVar63 * auVar319 + auVar62 * auVar318 + (auVar2 >> 0x34);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar64 * ZEXT816(0x1000003d1) + auVar61 * auVar317;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_200.n[1];
      auVar320._8_8_ = 0;
      auVar320._0_8_ = uVar512;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar513;
      auVar321._8_8_ = 0;
      auVar321._0_8_ = local_200.n[2];
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_200.n[3];
      auVar322._8_8_ = 0;
      auVar322._0_8_ = local_200.n[3];
      auVar3 = auVar67 * auVar322 + auVar66 * auVar321 + (auVar3 >> 0x34);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar5 = (auVar4 >> 0x34) + auVar65 * auVar320 + auVar68 * ZEXT816(0x1000003d10);
      uVar516 = auVar5._0_8_;
      uVar518 = auVar5._8_8_;
      auVar482._8_8_ = uVar518 >> 0x34;
      auVar482._0_8_ = uVar518 * 0x1000 | uVar516 >> 0x34;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_200.n[2];
      auVar323._8_8_ = 0;
      auVar323._0_8_ = uVar512;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_200.n[1];
      auVar324._8_8_ = 0;
      auVar324._0_8_ = local_200.n[1];
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar513;
      auVar325._8_8_ = 0;
      auVar325._0_8_ = local_200.n[3];
      auVar3 = auVar71 * auVar325 + (auVar3 >> 0x34);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = auVar3._0_8_;
      auVar482 = auVar72 * ZEXT816(0x1000003d10) + auVar70 * auVar324 + auVar69 * auVar323 +
                 auVar482;
      auVar5 = auVar482 >> 0x34;
      auVar494._8_8_ = 0;
      auVar494._0_8_ = auVar5._0_8_;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = auVar3._8_8_;
      auVar493._8_8_ = auVar5._8_8_;
      auVar493._0_8_ = auVar1._0_8_ & 0xffffffffffffe;
      auVar494 = auVar73 * ZEXT816(0x1000003d10000) + auVar493 + auVar494;
      uVar520 = auVar494._0_8_;
      uVar512 = (auVar4._0_8_ & 0xfffffffffffff) * 7;
      uVar513 = (uVar516 & 0xfffffffffffff) * 7;
      uVar516 = (auVar482._0_8_ & 0xfffffffffffff) * 7;
      uVar518 = (uVar520 & 0xfffffffffffff) * 7;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar512;
      auVar326._8_8_ = 0;
      auVar326._0_8_ = local_200.n[3];
      uVar520 = ((auVar494._8_8_ << 0xc | uVar520 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff)) * 7;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar513;
      auVar327._8_8_ = 0;
      auVar327._0_8_ = local_200.n[2];
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar516;
      auVar328._8_8_ = 0;
      auVar328._0_8_ = local_200.n[1];
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar518;
      auVar329._8_8_ = 0;
      auVar329._0_8_ = local_200.n[0];
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar520;
      auVar330._8_8_ = 0;
      auVar330._0_8_ = local_200.n[4];
      auVar79._8_8_ = 0;
      auVar79._0_8_ = SUB168(auVar78 * auVar330,0);
      auVar1 = auVar74 * auVar326 + auVar75 * auVar327 + auVar76 * auVar328 + auVar77 * auVar329 +
               auVar79 * ZEXT816(0x1000003d10);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar512;
      auVar331._8_8_ = 0;
      auVar331._0_8_ = local_200.n[4];
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar513;
      auVar332._8_8_ = 0;
      auVar332._0_8_ = local_200.n[3];
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar516;
      auVar333._8_8_ = 0;
      auVar333._0_8_ = local_200.n[2];
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar518;
      auVar334._8_8_ = 0;
      auVar334._0_8_ = local_200.n[1];
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar520;
      auVar335._8_8_ = 0;
      auVar335._0_8_ = local_200.n[0];
      auVar85._8_8_ = 0;
      auVar85._0_8_ = SUB168(auVar78 * auVar330,8);
      auVar2 = auVar85 * ZEXT816(0x1000003d10000) +
               auVar84 * auVar335 +
               auVar83 * auVar334 + auVar82 * auVar333 + auVar80 * auVar331 + auVar81 * auVar332 +
               (auVar1 >> 0x34);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar512;
      auVar336._8_8_ = 0;
      auVar336._0_8_ = local_200.n[0];
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar513;
      auVar337._8_8_ = 0;
      auVar337._0_8_ = local_200.n[4];
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar516;
      auVar338._8_8_ = 0;
      auVar338._0_8_ = local_200.n[3];
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar518;
      auVar339._8_8_ = 0;
      auVar339._0_8_ = local_200.n[2];
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar520;
      auVar340._8_8_ = 0;
      auVar340._0_8_ = local_200.n[1];
      auVar3 = auVar90 * auVar340 + auVar89 * auVar339 + auVar88 * auVar338 + auVar87 * auVar337 +
               (auVar2 >> 0x34);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar86 * auVar336 + auVar91 * ZEXT816(0x1000003d1);
      uVar522 = auVar4._0_8_;
      uVar514 = auVar4._8_8_;
      auVar483._8_8_ = uVar514 >> 0x34;
      auVar483._0_8_ = uVar514 * 0x1000 | uVar522 >> 0x34;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar512;
      auVar341._8_8_ = 0;
      auVar341._0_8_ = local_200.n[1];
      local_280 = SUB168(auVar92 * auVar341,0);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar513;
      auVar342._8_8_ = 0;
      auVar342._0_8_ = local_200.n[0];
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar516;
      auVar343._8_8_ = 0;
      auVar343._0_8_ = local_200.n[4];
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar518;
      auVar344._8_8_ = 0;
      auVar344._0_8_ = local_200.n[3];
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar520;
      auVar345._8_8_ = 0;
      auVar345._0_8_ = local_200.n[2];
      auVar3 = auVar96 * auVar345 + auVar95 * auVar344 + auVar94 * auVar343 + (auVar3 >> 0x34);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar483 = auVar97 * ZEXT816(0x1000003d10) + auVar92 * auVar341 + auVar93 * auVar342 +
                 auVar483;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar512;
      auVar346._8_8_ = 0;
      auVar346._0_8_ = local_200.n[2];
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar513;
      auVar347._8_8_ = 0;
      auVar347._0_8_ = local_200.n[1];
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar516;
      auVar348._8_8_ = 0;
      auVar348._0_8_ = local_200.n[0];
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar518;
      auVar349._8_8_ = 0;
      auVar349._0_8_ = local_200.n[4];
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar520;
      auVar350._8_8_ = 0;
      auVar350._0_8_ = local_200.n[3];
      auVar3 = auVar102 * auVar350 + auVar101 * auVar349 + (auVar3 >> 0x34);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = auVar3._0_8_;
      auVar4 = auVar103 * ZEXT816(0x1000003d10) +
               auVar100 * auVar348 + auVar98 * auVar346 + auVar99 * auVar347 + (auVar483 >> 0x34);
      auVar5 = auVar4 >> 0x34;
      auVar496._8_8_ = 0;
      auVar496._0_8_ = auVar5._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = auVar3._8_8_;
      auVar495._8_8_ = auVar5._8_8_;
      auVar495._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar496 = auVar104 * ZEXT816(0x1000003d10000) + auVar495 + auVar496;
      uVar512 = auVar496._0_8_;
      uVar515 = (uVar512 & 0xfffffffffffff) + (uVar515 & 0xfffffffffffff);
      uVar516 = (uVar522 & 0xfffffffffffff) + local_260;
      uVar517 = (auVar483._0_8_ & 0xfffffffffffff) + local_268;
      uVar522 = (auVar4._0_8_ & 0xfffffffffffff) + local_270;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar516;
      auVar351._8_8_ = 0;
      auVar351._0_8_ = local_d8.n[3];
      uVar514 = (auVar2._0_8_ & 0xffffffffffff) + local_258 + local_278 +
                (auVar496._8_8_ << 0xc | uVar512 >> 0x34);
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar517;
      auVar352._8_8_ = 0;
      auVar352._0_8_ = local_d8.n[2];
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar522;
      auVar353._8_8_ = 0;
      auVar353._0_8_ = local_d8.n[1];
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar515;
      auVar354._8_8_ = 0;
      auVar354._0_8_ = local_d8.n[0];
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar514;
      auVar355._8_8_ = 0;
      auVar355._0_8_ = local_d8.n[4];
      auVar110._8_8_ = 0;
      auVar110._0_8_ = SUB168(auVar109 * auVar355,0);
      auVar1 = auVar105 * auVar351 + auVar106 * auVar352 + auVar107 * auVar353 + auVar108 * auVar354
               + auVar110 * ZEXT816(0x1000003d10);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar516;
      auVar356._8_8_ = 0;
      auVar356._0_8_ = local_d8.n[4];
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uVar517;
      auVar357._8_8_ = 0;
      auVar357._0_8_ = local_d8.n[3];
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar522;
      auVar358._8_8_ = 0;
      auVar358._0_8_ = local_d8.n[2];
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar515;
      auVar359._8_8_ = 0;
      auVar359._0_8_ = local_d8.n[1];
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uVar514;
      auVar360._8_8_ = 0;
      auVar360._0_8_ = local_d8.n[0];
      auVar116._8_8_ = 0;
      auVar116._0_8_ = SUB168(auVar109 * auVar355,8);
      auVar2 = auVar116 * ZEXT816(0x1000003d10000) +
               auVar115 * auVar360 +
               auVar114 * auVar359 + auVar113 * auVar358 + auVar112 * auVar357 + auVar111 * auVar356
               + (auVar1 >> 0x34);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = uVar516;
      auVar361._8_8_ = 0;
      auVar361._0_8_ = local_d8.n[0];
      auVar118._8_8_ = 0;
      auVar118._0_8_ = uVar517;
      auVar362._8_8_ = 0;
      auVar362._0_8_ = local_d8.n[4];
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uVar522;
      auVar363._8_8_ = 0;
      auVar363._0_8_ = local_d8.n[3];
      auVar120._8_8_ = 0;
      auVar120._0_8_ = uVar515;
      auVar364._8_8_ = 0;
      auVar364._0_8_ = local_d8.n[2];
      auVar121._8_8_ = 0;
      auVar121._0_8_ = uVar514;
      auVar365._8_8_ = 0;
      auVar365._0_8_ = local_d8.n[1];
      auVar3 = auVar121 * auVar365 + auVar120 * auVar364 + auVar119 * auVar363 + auVar118 * auVar362
               + (auVar2 >> 0x34);
      auVar122._8_8_ = 0;
      auVar122._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar117 * auVar361 + auVar122 * ZEXT816(0x1000003d1);
      uVar512 = auVar4._0_8_;
      uVar513 = auVar4._8_8_;
      local_88.x.n[0] = uVar512 & 0xfffffffffffff;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uVar516;
      auVar366._8_8_ = 0;
      auVar366._0_8_ = local_d8.n[1];
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uVar517;
      auVar367._8_8_ = 0;
      auVar367._0_8_ = local_d8.n[0];
      auVar484._8_8_ = uVar513 >> 0x34;
      auVar484._0_8_ = uVar513 * 0x1000 | uVar512 >> 0x34;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = uVar522;
      auVar368._8_8_ = 0;
      auVar368._0_8_ = local_d8.n[4];
      auVar126._8_8_ = 0;
      auVar126._0_8_ = uVar515;
      auVar369._8_8_ = 0;
      auVar369._0_8_ = local_d8.n[3];
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar514;
      auVar370._8_8_ = 0;
      auVar370._0_8_ = local_d8.n[2];
      auVar3 = auVar127 * auVar370 + auVar126 * auVar369 + auVar125 * auVar368 + (auVar3 >> 0x34);
      auVar128._8_8_ = 0;
      auVar128._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar484 = auVar128 * ZEXT816(0x1000003d10) + auVar123 * auVar366 + auVar124 * auVar367 +
                 auVar484;
      local_88.x.n[1] = auVar484._0_8_ & 0xfffffffffffff;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = uVar516;
      auVar371._8_8_ = 0;
      auVar371._0_8_ = local_d8.n[2];
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar517;
      auVar372._8_8_ = 0;
      auVar372._0_8_ = local_d8.n[1];
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uVar522;
      auVar373._8_8_ = 0;
      auVar373._0_8_ = local_d8.n[0];
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uVar515;
      auVar374._8_8_ = 0;
      auVar374._0_8_ = local_d8.n[4];
      auVar133._8_8_ = 0;
      auVar133._0_8_ = uVar514;
      auVar375._8_8_ = 0;
      auVar375._0_8_ = local_d8.n[3];
      auVar3 = auVar133 * auVar375 + auVar132 * auVar374 + (auVar3 >> 0x34);
      auVar134._8_8_ = 0;
      auVar134._0_8_ = auVar3._0_8_;
      auVar4 = auVar134 * ZEXT816(0x1000003d10) +
               auVar131 * auVar373 + auVar130 * auVar372 + auVar129 * auVar371 + (auVar484 >> 0x34);
      auVar5 = auVar4 >> 0x34;
      auVar498._8_8_ = 0;
      auVar498._0_8_ = auVar5._0_8_;
      local_88.x.n[2] = auVar4._0_8_ & 0xfffffffffffff;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = auVar3._8_8_;
      auVar497._8_8_ = auVar5._8_8_;
      auVar497._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar498 = auVar135 * ZEXT816(0x1000003d10000) + auVar497 + auVar498;
      local_88.x.n[3] = auVar498._0_8_;
      local_88.x.n[4] =
           (auVar498._8_8_ << 0xc | local_88.x.n[3] >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      local_88.x.n[3] = local_88.x.n[3] & 0xfffffffffffff;
      uVar512 = uVar516 * 2;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uVar515;
      auVar376._8_8_ = 0;
      auVar376._0_8_ = uVar512;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uVar522;
      auVar377._8_8_ = 0;
      auVar377._0_8_ = uVar517 * 2;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar514;
      auVar378._8_8_ = 0;
      auVar378._0_8_ = uVar514;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = SUB168(auVar138 * auVar378,0);
      auVar1 = auVar136 * auVar376 + auVar137 * auVar377 + auVar139 * ZEXT816(0x1000003d10);
      uVar513 = uVar514 * 2;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar513;
      auVar379._8_8_ = 0;
      auVar379._0_8_ = uVar516;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = uVar515;
      auVar380._8_8_ = 0;
      auVar380._0_8_ = uVar517 * 2;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = uVar522;
      auVar381._8_8_ = 0;
      auVar381._0_8_ = uVar522;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = SUB168(auVar138 * auVar378,8);
      auVar2 = auVar143 * ZEXT816(0x1000003d10000) +
               auVar140 * auVar379 + auVar142 * auVar381 + auVar141 * auVar380 + (auVar1 >> 0x34);
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uVar516;
      auVar382._8_8_ = 0;
      auVar382._0_8_ = uVar516;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar513;
      auVar383._8_8_ = 0;
      auVar383._0_8_ = uVar517;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar515;
      auVar384._8_8_ = 0;
      auVar384._0_8_ = uVar522 * 2;
      auVar3 = auVar146 * auVar384 + auVar145 * auVar383 + (auVar2 >> 0x34);
      auVar147._8_8_ = 0;
      auVar147._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar147 * ZEXT816(0x1000003d1) + auVar144 * auVar382;
      local_88.y.n[0] = auVar4._0_8_;
      auVar510._8_8_ = 0;
      auVar510._0_8_ = auVar4._8_8_ << 0xc | local_88.y.n[0] >> 0x34;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar517;
      auVar385._8_8_ = 0;
      auVar385._0_8_ = uVar512;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar513;
      auVar386._8_8_ = 0;
      auVar386._0_8_ = uVar522;
      local_88.y.n[0] = local_88.y.n[0] & 0xfffffffffffff;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar515;
      auVar387._8_8_ = 0;
      auVar387._0_8_ = uVar515;
      auVar3 = auVar149 * auVar386 + auVar150 * auVar387 + (auVar3 >> 0x34);
      auVar151._8_8_ = 0;
      auVar151._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar510 = auVar148 * auVar385 + auVar151 * ZEXT816(0x1000003d10) + auVar510;
      uVar518 = auVar510._0_8_;
      uVar520 = auVar510._8_8_;
      local_88.y.n[1] = uVar518 & 0xfffffffffffff;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar522;
      auVar388._8_8_ = 0;
      auVar388._0_8_ = uVar512;
      auVar485._8_8_ = uVar520 >> 0x34;
      auVar485._0_8_ = uVar520 * 0x1000 | uVar518 >> 0x34;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar517;
      auVar389._8_8_ = 0;
      auVar389._0_8_ = uVar517;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = uVar513;
      auVar390._8_8_ = 0;
      auVar390._0_8_ = uVar515;
      auVar3 = auVar154 * auVar390 + (auVar3 >> 0x34);
      auVar155._8_8_ = 0;
      auVar155._0_8_ = auVar3._0_8_;
      auVar485 = auVar155 * ZEXT816(0x1000003d10) + auVar153 * auVar389 + auVar152 * auVar388 +
                 auVar485;
      auVar4 = auVar485 >> 0x34;
      auVar500._8_8_ = 0;
      auVar500._0_8_ = auVar4._0_8_;
      local_88.y.n[2] = auVar485._0_8_ & 0xfffffffffffff;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = auVar3._8_8_;
      auVar499._8_8_ = auVar4._8_8_;
      auVar499._0_8_ = auVar1._0_8_ & 0xffffffffffffe;
      auVar500 = auVar156 * ZEXT816(0x1000003d10000) + auVar499 + auVar500;
      uVar512 = auVar500._0_8_;
      local_88.y.n[3] = uVar512 & 0xfffffffffffff;
      local_88.y.n[4] = (auVar500._8_8_ << 0xc | uVar512 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      local_88.infinity = 0;
      local_228.d[0] = local_250;
      local_228.d[1] = local_248;
      secp256k1_ecmult_const(&local_1d8,&local_88,&local_228);
      uVar513 = local_1d8.z.n[0] * 2;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = local_1d8.z.n[3];
      auVar391._8_8_ = 0;
      auVar391._0_8_ = uVar513;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = local_1d8.z.n[2];
      auVar392._8_8_ = 0;
      auVar392._0_8_ = local_1d8.z.n[1] * 2;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = local_1d8.z.n[4];
      auVar393._8_8_ = 0;
      auVar393._0_8_ = local_1d8.z.n[4];
      auVar160._8_8_ = 0;
      auVar160._0_8_ = SUB168(auVar159 * auVar393,0);
      auVar4 = auVar158 * auVar392 + auVar157 * auVar391 + auVar160 * ZEXT816(0x1000003d10);
      uVar512 = local_1d8.z.n[4] * 2;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = uVar512;
      auVar394._8_8_ = 0;
      auVar394._0_8_ = local_1d8.z.n[0];
      auVar162._8_8_ = 0;
      auVar162._0_8_ = local_1d8.z.n[3];
      auVar395._8_8_ = 0;
      auVar395._0_8_ = local_1d8.z.n[1] * 2;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = local_1d8.z.n[2];
      auVar396._8_8_ = 0;
      auVar396._0_8_ = local_1d8.z.n[2];
      auVar164._8_8_ = 0;
      auVar164._0_8_ = SUB168(auVar159 * auVar393,8);
      auVar1 = auVar164 * ZEXT816(0x1000003d10000) +
               auVar161 * auVar394 + auVar163 * auVar396 + auVar162 * auVar395 + (auVar4 >> 0x34);
      auVar165._8_8_ = 0;
      auVar165._0_8_ = local_1d8.z.n[0];
      auVar397._8_8_ = 0;
      auVar397._0_8_ = local_1d8.z.n[0];
      auVar166._8_8_ = 0;
      auVar166._0_8_ = uVar512;
      auVar398._8_8_ = 0;
      auVar398._0_8_ = local_1d8.z.n[1];
      auVar167._8_8_ = 0;
      auVar167._0_8_ = local_1d8.z.n[3];
      auVar399._8_8_ = 0;
      auVar399._0_8_ = local_1d8.z.n[2] * 2;
      auVar2 = auVar167 * auVar399 + auVar166 * auVar398 + (auVar1 >> 0x34);
      auVar168._8_8_ = 0;
      auVar168._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar3 = auVar168 * ZEXT816(0x1000003d1) + auVar165 * auVar397;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = local_1d8.z.n[1];
      auVar400._8_8_ = 0;
      auVar400._0_8_ = uVar513;
      auVar170._8_8_ = 0;
      auVar170._0_8_ = uVar512;
      auVar401._8_8_ = 0;
      auVar401._0_8_ = local_1d8.z.n[2];
      auVar171._8_8_ = 0;
      auVar171._0_8_ = local_1d8.z.n[3];
      auVar402._8_8_ = 0;
      auVar402._0_8_ = local_1d8.z.n[3];
      auVar2 = auVar171 * auVar402 + auVar170 * auVar401 + (auVar2 >> 0x34);
      auVar172._8_8_ = 0;
      auVar172._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar5 = auVar172 * ZEXT816(0x1000003d10) + auVar169 * auVar400 + (auVar3 >> 0x34);
      auVar173._8_8_ = 0;
      auVar173._0_8_ = local_1d8.z.n[2];
      auVar403._8_8_ = 0;
      auVar403._0_8_ = uVar513;
      auVar174._8_8_ = 0;
      auVar174._0_8_ = local_1d8.z.n[1];
      auVar404._8_8_ = 0;
      auVar404._0_8_ = local_1d8.z.n[1];
      auVar175._8_8_ = 0;
      auVar175._0_8_ = uVar512;
      auVar405._8_8_ = 0;
      auVar405._0_8_ = local_1d8.z.n[3];
      auVar2 = auVar175 * auVar405 + (auVar2 >> 0x34);
      auVar176._8_8_ = 0;
      auVar176._0_8_ = auVar2._0_8_;
      auVar6 = auVar176 * ZEXT816(0x1000003d10) + auVar174 * auVar404 + auVar173 * auVar403 +
               (auVar5 >> 0x34);
      auVar7 = auVar6 >> 0x34;
      auVar501._8_8_ = auVar7._8_8_;
      auVar501._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
      auVar502._8_8_ = 0;
      auVar502._0_8_ = auVar7._0_8_;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = auVar2._8_8_;
      auVar502 = auVar177 * ZEXT816(0x1000003d10000) + auVar501 + auVar502;
      uVar521 = auVar502._0_8_;
      uVar518 = (auVar502._8_8_ << 0xc | uVar521 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
      uVar512 = auVar3._0_8_ & 0xfffffffffffff;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = uVar512;
      auVar406._8_8_ = 0;
      auVar406._0_8_ = uVar515;
      uVar520 = auVar5._0_8_ & 0xfffffffffffff;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = uVar520;
      auVar407._8_8_ = 0;
      auVar407._0_8_ = uVar522;
      uVar519 = auVar6._0_8_ & 0xfffffffffffff;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = uVar519;
      auVar408._8_8_ = 0;
      auVar408._0_8_ = uVar517;
      uVar521 = uVar521 & 0xfffffffffffff;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = uVar521;
      auVar409._8_8_ = 0;
      auVar409._0_8_ = uVar516;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = uVar514;
      auVar410._8_8_ = 0;
      auVar410._0_8_ = uVar518;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = SUB168(auVar182 * auVar410,0);
      auVar1 = auVar183 * ZEXT816(0x1000003d10) +
               auVar178 * auVar406 + auVar180 * auVar408 + auVar181 * auVar409 + auVar179 * auVar407
      ;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = uVar512;
      auVar411._8_8_ = 0;
      auVar411._0_8_ = uVar514;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = uVar520;
      auVar412._8_8_ = 0;
      auVar412._0_8_ = uVar515;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = uVar519;
      auVar413._8_8_ = 0;
      auVar413._0_8_ = uVar522;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = uVar521;
      auVar414._8_8_ = 0;
      auVar414._0_8_ = uVar517;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = uVar516;
      auVar415._8_8_ = 0;
      auVar415._0_8_ = uVar518;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = SUB168(auVar182 * auVar410,8);
      auVar2 = auVar189 * ZEXT816(0x1000003d10000) +
               auVar185 * auVar412 +
               auVar184 * auVar411 + auVar186 * auVar413 + auVar188 * auVar415 + auVar187 * auVar414
               + (auVar1 >> 0x34);
      auVar190._8_8_ = 0;
      auVar190._0_8_ = uVar512;
      auVar416._8_8_ = 0;
      auVar416._0_8_ = uVar516;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = uVar520;
      auVar417._8_8_ = 0;
      auVar417._0_8_ = uVar514;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = uVar519;
      auVar418._8_8_ = 0;
      auVar418._0_8_ = uVar515;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = uVar521;
      auVar419._8_8_ = 0;
      auVar419._0_8_ = uVar522;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = uVar517;
      auVar420._8_8_ = 0;
      auVar420._0_8_ = uVar518;
      auVar3 = auVar192 * auVar418 + auVar193 * auVar419 + auVar194 * auVar420 + auVar191 * auVar417
               + (auVar2 >> 0x34);
      auVar195._8_8_ = 0;
      auVar195._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar190 * auVar416 + auVar195 * ZEXT816(0x1000003d1);
      uVar513 = auVar4._0_8_;
      auVar503._8_8_ = 0;
      auVar503._0_8_ = auVar4._8_8_ * 0x1000 | uVar513 >> 0x34;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = uVar512;
      auVar421._8_8_ = 0;
      auVar421._0_8_ = uVar517;
      auVar197._8_8_ = 0;
      auVar197._0_8_ = uVar520;
      auVar422._8_8_ = 0;
      auVar422._0_8_ = uVar516;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = uVar519;
      auVar423._8_8_ = 0;
      auVar423._0_8_ = uVar514;
      auVar199._8_8_ = 0;
      auVar199._0_8_ = uVar521;
      auVar424._8_8_ = 0;
      auVar424._0_8_ = uVar515;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = uVar522;
      auVar425._8_8_ = 0;
      auVar425._0_8_ = uVar518;
      auVar3 = auVar199 * auVar424 + auVar200 * auVar425 + auVar198 * auVar423 + (auVar3 >> 0x34);
      auVar201._8_8_ = 0;
      auVar201._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar503 = auVar201 * ZEXT816(0x1000003d10) + auVar196 * auVar421 + auVar197 * auVar422 +
                 auVar503;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = uVar512;
      auVar426._8_8_ = 0;
      auVar426._0_8_ = uVar522;
      auVar203._8_8_ = 0;
      auVar203._0_8_ = uVar520;
      auVar427._8_8_ = 0;
      auVar427._0_8_ = uVar517;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = uVar519;
      auVar428._8_8_ = 0;
      auVar428._0_8_ = uVar516;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = uVar521;
      auVar429._8_8_ = 0;
      auVar429._0_8_ = uVar514;
      auVar206._8_8_ = 0;
      auVar206._0_8_ = uVar515;
      auVar430._8_8_ = 0;
      auVar430._0_8_ = uVar518;
      auVar3 = auVar206 * auVar430 + auVar205 * auVar429 + (auVar3 >> 0x34);
      auVar207._8_8_ = 0;
      auVar207._0_8_ = auVar3._0_8_;
      auVar4 = auVar203 * auVar427 + auVar204 * auVar428 + auVar202 * auVar426 +
               auVar207 * ZEXT816(0x1000003d10) + (auVar503 >> 0x34);
      auVar5 = auVar4 >> 0x34;
      auVar505._8_8_ = 0;
      auVar505._0_8_ = auVar5._0_8_;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = auVar3._8_8_;
      auVar504._8_8_ = auVar5._8_8_;
      auVar504._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar505 = auVar208 * ZEXT816(0x1000003d10000) + auVar504 + auVar505;
      uVar518 = auVar505._0_8_;
      uVar513 = uVar513 & 0xfffffffffffff;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = uVar513;
      auVar431._8_8_ = 0;
      auVar431._0_8_ = local_200.n[3];
      uVar520 = (auVar505._8_8_ << 0xc | uVar518 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      uVar522 = auVar503._0_8_ & 0xfffffffffffff;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = uVar522;
      auVar432._8_8_ = 0;
      auVar432._0_8_ = local_200.n[2];
      uVar516 = auVar4._0_8_ & 0xfffffffffffff;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = uVar516;
      auVar433._8_8_ = 0;
      auVar433._0_8_ = local_200.n[1];
      uVar518 = uVar518 & 0xfffffffffffff;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = uVar518;
      auVar434._8_8_ = 0;
      auVar434._0_8_ = local_200.n[0];
      auVar213._8_8_ = 0;
      auVar213._0_8_ = uVar520;
      auVar435._8_8_ = 0;
      auVar435._0_8_ = local_200.n[4];
      auVar214._8_8_ = 0;
      auVar214._0_8_ = SUB168(auVar213 * auVar435,0);
      auVar4 = auVar210 * auVar432 + auVar209 * auVar431 + auVar211 * auVar433 + auVar212 * auVar434
               + auVar214 * ZEXT816(0x1000003d10);
      auVar215._8_8_ = 0;
      auVar215._0_8_ = uVar513;
      auVar436._8_8_ = 0;
      auVar436._0_8_ = local_200.n[4];
      auVar216._8_8_ = 0;
      auVar216._0_8_ = uVar522;
      auVar437._8_8_ = 0;
      auVar437._0_8_ = local_200.n[3];
      auVar217._8_8_ = 0;
      auVar217._0_8_ = uVar516;
      auVar438._8_8_ = 0;
      auVar438._0_8_ = local_200.n[2];
      auVar218._8_8_ = 0;
      auVar218._0_8_ = uVar518;
      auVar439._8_8_ = 0;
      auVar439._0_8_ = local_200.n[1];
      auVar219._8_8_ = 0;
      auVar219._0_8_ = uVar520;
      auVar440._8_8_ = 0;
      auVar440._0_8_ = local_200.n[0];
      auVar220._8_8_ = 0;
      auVar220._0_8_ = SUB168(auVar213 * auVar435,8);
      auVar1 = auVar220 * ZEXT816(0x1000003d10000) +
               auVar219 * auVar440 +
               auVar218 * auVar439 + auVar217 * auVar438 + auVar215 * auVar436 + auVar216 * auVar437
               + (auVar4 >> 0x34);
      auVar221._8_8_ = 0;
      auVar221._0_8_ = uVar513;
      auVar441._8_8_ = 0;
      auVar441._0_8_ = local_200.n[0];
      auVar222._8_8_ = 0;
      auVar222._0_8_ = uVar522;
      auVar442._8_8_ = 0;
      auVar442._0_8_ = local_200.n[4];
      auVar223._8_8_ = 0;
      auVar223._0_8_ = uVar516;
      auVar443._8_8_ = 0;
      auVar443._0_8_ = local_200.n[3];
      auVar224._8_8_ = 0;
      auVar224._0_8_ = uVar518;
      auVar444._8_8_ = 0;
      auVar444._0_8_ = local_200.n[2];
      auVar225._8_8_ = 0;
      auVar225._0_8_ = uVar520;
      auVar445._8_8_ = 0;
      auVar445._0_8_ = local_200.n[1];
      auVar2 = auVar225 * auVar445 + auVar224 * auVar444 + auVar223 * auVar443 + auVar222 * auVar442
               + (auVar1 >> 0x34);
      auVar226._8_8_ = 0;
      auVar226._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar3 = auVar221 * auVar441 + auVar226 * ZEXT816(0x1000003d1);
      uVar512 = auVar3._0_8_;
      uVar514 = auVar3._8_8_;
      local_b0.n[0] = uVar512 & 0xfffffffffffff;
      auVar227._8_8_ = 0;
      auVar227._0_8_ = uVar513;
      auVar446._8_8_ = 0;
      auVar446._0_8_ = local_200.n[1];
      auVar228._8_8_ = 0;
      auVar228._0_8_ = uVar522;
      auVar447._8_8_ = 0;
      auVar447._0_8_ = local_200.n[0];
      auVar486._8_8_ = uVar514 >> 0x34;
      auVar486._0_8_ = uVar514 * 0x1000 | uVar512 >> 0x34;
      auVar229._8_8_ = 0;
      auVar229._0_8_ = uVar516;
      auVar448._8_8_ = 0;
      auVar448._0_8_ = local_200.n[4];
      auVar230._8_8_ = 0;
      auVar230._0_8_ = uVar518;
      auVar449._8_8_ = 0;
      auVar449._0_8_ = local_200.n[3];
      auVar231._8_8_ = 0;
      auVar231._0_8_ = uVar520;
      auVar450._8_8_ = 0;
      auVar450._0_8_ = local_200.n[2];
      auVar2 = auVar231 * auVar450 + auVar230 * auVar449 + auVar229 * auVar448 + (auVar2 >> 0x34);
      auVar232._8_8_ = 0;
      auVar232._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar486 = auVar232 * ZEXT816(0x1000003d10) + auVar227 * auVar446 + auVar228 * auVar447 +
                 auVar486;
      local_b0.n[1] = auVar486._0_8_ & 0xfffffffffffff;
      auVar233._8_8_ = 0;
      auVar233._0_8_ = uVar513;
      auVar451._8_8_ = 0;
      auVar451._0_8_ = local_200.n[2];
      auVar234._8_8_ = 0;
      auVar234._0_8_ = uVar522;
      auVar452._8_8_ = 0;
      auVar452._0_8_ = local_200.n[1];
      auVar235._8_8_ = 0;
      auVar235._0_8_ = uVar516;
      auVar453._8_8_ = 0;
      auVar453._0_8_ = local_200.n[0];
      auVar236._8_8_ = 0;
      auVar236._0_8_ = uVar518;
      auVar454._8_8_ = 0;
      auVar454._0_8_ = local_200.n[4];
      auVar237._8_8_ = 0;
      auVar237._0_8_ = uVar520;
      auVar455._8_8_ = 0;
      auVar455._0_8_ = local_200.n[3];
      auVar2 = auVar237 * auVar455 + auVar236 * auVar454 + (auVar2 >> 0x34);
      auVar238._8_8_ = 0;
      auVar238._0_8_ = auVar2._0_8_;
      auVar3 = auVar238 * ZEXT816(0x1000003d10) +
               auVar235 * auVar453 + auVar233 * auVar451 + auVar234 * auVar452 + (auVar486 >> 0x34);
      auVar5 = auVar3 >> 0x34;
      auVar507._8_8_ = 0;
      auVar507._0_8_ = auVar5._0_8_;
      local_b0.n[2] = auVar3._0_8_ & 0xfffffffffffff;
      auVar239._8_8_ = 0;
      auVar239._0_8_ = auVar2._8_8_;
      auVar506._8_8_ = auVar5._8_8_;
      auVar506._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar507 = auVar239 * ZEXT816(0x1000003d10000) + auVar506 + auVar507;
      uVar512 = auVar507._0_8_;
      local_b0.n[3] = uVar512 & 0xfffffffffffff;
      local_b0.n[4] = (auVar507._8_8_ << 0xc | uVar512 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
      secp256k1_fe_impl_inv(&local_b0,&local_b0);
      auVar240._8_8_ = 0;
      auVar240._0_8_ = local_b0.n[3];
      auVar456._8_8_ = 0;
      auVar456._0_8_ = local_1d8.x.n[0];
      auVar241._8_8_ = 0;
      auVar241._0_8_ = local_b0.n[2];
      auVar457._8_8_ = 0;
      auVar457._0_8_ = local_1d8.x.n[1];
      auVar242._8_8_ = 0;
      auVar242._0_8_ = local_b0.n[1];
      auVar458._8_8_ = 0;
      auVar458._0_8_ = local_1d8.x.n[2];
      auVar243._8_8_ = 0;
      auVar243._0_8_ = local_b0.n[0];
      auVar459._8_8_ = 0;
      auVar459._0_8_ = local_1d8.x.n[3];
      auVar244._8_8_ = 0;
      auVar244._0_8_ = local_b0.n[4];
      auVar460._8_8_ = 0;
      auVar460._0_8_ = local_1d8.x.n[4];
      auVar245._8_8_ = 0;
      auVar245._0_8_ = SUB168(auVar244 * auVar460,0);
      auVar4 = auVar241 * auVar457 + auVar240 * auVar456 + auVar242 * auVar458 + auVar243 * auVar459
               + auVar245 * ZEXT816(0x1000003d10);
      auVar246._8_8_ = 0;
      auVar246._0_8_ = local_b0.n[4];
      auVar461._8_8_ = 0;
      auVar461._0_8_ = local_1d8.x.n[0];
      auVar247._8_8_ = 0;
      auVar247._0_8_ = local_b0.n[3];
      auVar462._8_8_ = 0;
      auVar462._0_8_ = local_1d8.x.n[1];
      auVar248._8_8_ = 0;
      auVar248._0_8_ = local_b0.n[2];
      auVar463._8_8_ = 0;
      auVar463._0_8_ = local_1d8.x.n[2];
      auVar249._8_8_ = 0;
      auVar249._0_8_ = local_b0.n[1];
      auVar464._8_8_ = 0;
      auVar464._0_8_ = local_1d8.x.n[3];
      auVar250._8_8_ = 0;
      auVar250._0_8_ = local_b0.n[0];
      auVar465._8_8_ = 0;
      auVar465._0_8_ = local_1d8.x.n[4];
      auVar251._8_8_ = 0;
      auVar251._0_8_ = SUB168(auVar244 * auVar460,8);
      auVar1 = auVar251 * ZEXT816(0x1000003d10000) +
               auVar250 * auVar465 + auVar249 * auVar464 + auVar248 * auVar463 + auVar247 * auVar462
               + auVar246 * auVar461 + (auVar4 >> 0x34);
      auVar252._8_8_ = 0;
      auVar252._0_8_ = local_b0.n[0];
      auVar466._8_8_ = 0;
      auVar466._0_8_ = local_1d8.x.n[0];
      auVar253._8_8_ = 0;
      auVar253._0_8_ = local_b0.n[4];
      auVar467._8_8_ = 0;
      auVar467._0_8_ = local_1d8.x.n[1];
      auVar254._8_8_ = 0;
      auVar254._0_8_ = local_b0.n[3];
      auVar468._8_8_ = 0;
      auVar468._0_8_ = local_1d8.x.n[2];
      auVar255._8_8_ = 0;
      auVar255._0_8_ = local_b0.n[2];
      auVar469._8_8_ = 0;
      auVar469._0_8_ = local_1d8.x.n[3];
      auVar256._8_8_ = 0;
      auVar256._0_8_ = local_b0.n[1];
      auVar470._8_8_ = 0;
      auVar470._0_8_ = local_1d8.x.n[4];
      auVar2 = (auVar1 >> 0x34) +
               auVar256 * auVar470 + auVar255 * auVar469 + auVar254 * auVar468 + auVar253 * auVar467
      ;
      uVar512 = auVar2._0_8_;
      uVar513 = auVar2._8_8_;
      auVar487._8_8_ = uVar513 >> 0x34;
      auVar487._0_8_ = uVar513 * 0x1000 | uVar512 >> 0x34;
      auVar257._8_8_ = 0;
      auVar257._0_8_ = uVar512 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1._6_2_ & 0xf);
      auVar2 = auVar252 * auVar466 + auVar257 * ZEXT816(0x1000003d1);
      uVar512 = auVar2._0_8_;
      uVar513 = auVar2._8_8_;
      local_158.n[0] = uVar512 & 0xfffffffffffff;
      auVar258._8_8_ = 0;
      auVar258._0_8_ = local_b0.n[1];
      auVar471._8_8_ = 0;
      auVar471._0_8_ = local_1d8.x.n[0];
      auVar259._8_8_ = 0;
      auVar259._0_8_ = local_b0.n[0];
      auVar472._8_8_ = 0;
      auVar472._0_8_ = local_1d8.x.n[1];
      auVar260._8_8_ = 0;
      auVar260._0_8_ = local_b0.n[4];
      auVar473._8_8_ = 0;
      auVar473._0_8_ = local_1d8.x.n[2];
      auVar488._8_8_ = uVar513 >> 0x34;
      auVar488._0_8_ = uVar513 * 0x1000 | uVar512 >> 0x34;
      auVar261._8_8_ = 0;
      auVar261._0_8_ = local_b0.n[3];
      auVar474._8_8_ = 0;
      auVar474._0_8_ = local_1d8.x.n[3];
      auVar262._8_8_ = 0;
      auVar262._0_8_ = local_b0.n[2];
      auVar475._8_8_ = 0;
      auVar475._0_8_ = local_1d8.x.n[4];
      auVar487 = auVar260 * auVar473 + auVar262 * auVar475 + auVar261 * auVar474 + auVar487;
      auVar263._8_8_ = 0;
      auVar263._0_8_ = auVar487._0_8_ & 0xfffffffffffff;
      auVar488 = auVar263 * ZEXT816(0x1000003d10) + auVar259 * auVar472 + auVar258 * auVar471 +
                 auVar488;
      local_158.n[1] = auVar488._0_8_ & 0xfffffffffffff;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = local_b0.n[2];
      auVar476._8_8_ = 0;
      auVar476._0_8_ = local_1d8.x.n[0];
      auVar265._8_8_ = 0;
      auVar265._0_8_ = local_b0.n[1];
      auVar477._8_8_ = 0;
      auVar477._0_8_ = local_1d8.x.n[1];
      auVar266._8_8_ = 0;
      auVar266._0_8_ = local_b0.n[0];
      auVar478._8_8_ = 0;
      auVar478._0_8_ = local_1d8.x.n[2];
      auVar267._8_8_ = 0;
      auVar267._0_8_ = local_b0.n[4];
      auVar479._8_8_ = 0;
      auVar479._0_8_ = local_1d8.x.n[3];
      auVar268._8_8_ = 0;
      auVar268._0_8_ = local_b0.n[3];
      auVar480._8_8_ = 0;
      auVar480._0_8_ = local_1d8.x.n[4];
      auVar2 = auVar268 * auVar480 + auVar267 * auVar479 + (auVar487 >> 0x34);
      auVar269._8_8_ = 0;
      auVar269._0_8_ = auVar2._0_8_;
      auVar3 = auVar269 * ZEXT816(0x1000003d10) +
               auVar266 * auVar478 + auVar264 * auVar476 + auVar265 * auVar477 + (auVar488 >> 0x34);
      auVar5 = auVar3 >> 0x34;
      auVar509._8_8_ = 0;
      auVar509._0_8_ = auVar5._0_8_;
      local_158.n[2] = auVar3._0_8_ & 0xfffffffffffff;
      auVar270._8_8_ = 0;
      auVar270._0_8_ = auVar2._8_8_;
      auVar508._8_8_ = auVar5._8_8_;
      auVar508._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar509 = auVar270 * ZEXT816(0x1000003d10000) + auVar508 + auVar509;
      uVar512 = auVar509._0_8_;
      local_158.n[3] = uVar512 & 0xfffffffffffff;
      local_158.n[4] = (auVar509._8_8_ << 0xc | uVar512 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
      secp256k1_fe_impl_normalize(&local_158);
      secp256k1_fe_impl_get_b32((uchar *)&local_1d8,&local_158);
      iVar511 = (*hashfp)(local_240,(uchar *)&local_1d8,local_238,local_230,data);
      return (uint)(local_284 == 0 && iVar511 != 0);
    }
    secp256k1_ellswift_xdh_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    secp256k1_memclear(sx, sizeof(sx));
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}